

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_client.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *addr;
  int iVar1;
  ostream *poVar2;
  simple_client local_60;
  
  if (argc == 3) {
    addr = argv[1];
    iVar1 = atoi(argv[2]);
    simple_client::simple_client(&local_60,addr,iVar1);
    iVar1 = simple_client::run(&local_60);
    simple_client::~simple_client(&local_60);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: simple_client <address> <port>");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char* argv[]) {
	if (argc != 3) {
		std::cerr << "Usage: simple_client <address> <port>" << std::endl;
		return -1;
	}

	return simple_client(argv[1], atoi(argv[2])).run();
}